

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_psraw_mips64el(uint64_t fs,uint64_t ft)

{
  int *piVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  LMIValue vs;
  
  uVar4 = (uint)ft & 0x7f;
  bVar3 = 0x1f;
  if (uVar4 < 0x1f) {
    bVar3 = (byte)uVar4;
  }
  vs.d = fs;
  lVar2 = 0;
  do {
    piVar1 = (int *)((long)&vs + lVar2 * 4);
    *piVar1 = *piVar1 >> (bVar3 & 0x1f);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return vs.d;
}

Assistant:

uint64_t helper_psraw(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 31) {
        ft = 31;
    }
    vs.d = fs;
    for (i = 0; i < 2; ++i) {
        vs.sw[i] >>= ft;
    }
    return vs.d;
}